

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledRepresentation::IfcStyledRepresentation
          (IfcStyledRepresentation *this)

{
  IfcStyledRepresentation *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcStyleModel).field_0xa0,"IfcStyledRepresentation");
  IfcStyleModel::IfcStyleModel(&this->super_IfcStyleModel,&PTR_construction_vtable_24__00f302a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledRepresentation,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledRepresentation,_0UL> *)
             &(this->super_IfcStyleModel).super_IfcRepresentation.field_0x90,
             &PTR_construction_vtable_24__00f302e8);
  (this->super_IfcStyleModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xf30210;
  *(undefined8 *)&(this->super_IfcStyleModel).field_0xa0 = 0xf30288;
  *(undefined8 *)&(this->super_IfcStyleModel).super_IfcRepresentation.field_0x80 = 0xf30238;
  *(undefined8 *)&(this->super_IfcStyleModel).super_IfcRepresentation.field_0x90 = 0xf30260;
  return;
}

Assistant:

IfcStyledRepresentation() : Object("IfcStyledRepresentation") {}